

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O1

void __thiscall
embree::sse2::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::TriangleMesh,_embree::TriangleMvMB<4>_>,_embree::Scene::BuildProgressMonitorInterface>
::splitByGeometry(BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::TriangleMesh,_embree::TriangleMvMB<4>_>,_embree::Scene::BuildProgressMonitorInterface>
                  *this,SetMB *set,SetMB *lset,SetMB *rset)

{
  PrimRefMB *pPVar1;
  Vec3fx *pVVar2;
  BBox<embree::Vec3fx> *pBVar3;
  BBox1f BVar4;
  BBox1f BVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar9;
  unsigned_long uVar10;
  unsigned_long uVar11;
  PrimRefMB *pPVar12;
  PrimRefVector pmVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar25;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar26;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar27;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar28;
  float fVar29;
  PrimRefMB *pPVar30;
  unsigned_long uVar31;
  ulong uVar32;
  ulong uVar33;
  PrimRefMB *pPVar34;
  ulong uVar35;
  size_t sVar36;
  size_t sVar37;
  ulong uVar38;
  bool bVar39;
  float fVar40;
  float fVar41;
  uint uVar42;
  float fVar43;
  float fVar44;
  uint uVar46;
  float fVar47;
  undefined1 auVar45 [16];
  undefined1 auVar48 [16];
  float fVar49;
  float fVar50;
  float fVar51;
  undefined1 auVar52 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar53;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar54;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar55;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar56;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar57;
  float fVar58;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float local_12c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_128;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_118;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_108;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_f8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_e8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_d8;
  float local_88;
  float fStack_84;
  
  uVar10 = (set->super_PrimInfoMB).object_range._begin;
  uVar11 = (set->super_PrimInfoMB).object_range._end;
  pPVar12 = set->prims->items;
  pPVar30 = pPVar12 + uVar10;
  fVar40 = pPVar12[uVar10].lbounds.bounds0.lower.field_0.m128[3];
  pPVar34 = pPVar12 + uVar11;
  fVar43 = 0.0;
  fVar47 = 1.0;
  fVar62 = 1.0;
  fVar60 = 0.0;
  local_d8.m128 = _DAT_01feba00;
  uVar33 = 0;
  sVar37 = 0;
  sVar36 = 0;
  local_f8.m128 = _DAT_01feba00;
  local_108.m128 = _DAT_01feb9f0;
  local_118.m128 = _DAT_01feba00;
  local_128.m128 = _DAT_01feb9f0;
  local_e8.m128 = _DAT_01feb9f0;
  uVar38 = 0;
  local_12c = 1.0;
  fVar49 = 0.0;
  fVar41 = 0.0;
  fVar44 = 1.0;
  aVar53 = _DAT_01feba00;
  aVar54 = _DAT_01feb9f0;
  aVar55 = _DAT_01feba00;
  aVar56 = _DAT_01feb9f0;
  aVar57 = _DAT_01feb9f0;
  aVar59 = _DAT_01feba00;
  while( true ) {
    pPVar1 = pPVar34 + -1;
    fVar29 = fVar49;
    while ((pPVar30 <= pPVar1 && ((pPVar30->lbounds).bounds0.lower.field_0.m128[3] == fVar40))) {
      aVar6 = (pPVar30->lbounds).bounds0.lower.field_0.field_1;
      aVar7 = (pPVar30->lbounds).bounds0.upper.field_0.field_1;
      aVar8 = (pPVar30->lbounds).bounds1.lower.field_0.field_1;
      aVar9 = (pPVar30->lbounds).bounds1.upper.field_0.field_1;
      aVar57.m128 = (__m128)minps(aVar57.m128,(undefined1  [16])aVar8);
      aVar56.m128 = (__m128)minps(aVar56.m128,(undefined1  [16])aVar6);
      local_d8.m128 = (__m128)maxps(local_d8.m128,(undefined1  [16])aVar9);
      aVar59.m128 = (__m128)maxps(aVar59.m128,(undefined1  [16])aVar7);
      auVar45._0_4_ = aVar7.x * 0.5 + aVar9.x * 0.5 + aVar6.x * 0.5 + aVar8.x * 0.5;
      auVar45._4_4_ = aVar7.y * 0.5 + aVar9.y * 0.5 + aVar6.y * 0.5 + aVar8.y * 0.5;
      auVar45._8_4_ = aVar7.z * 0.5 + aVar9.z * 0.5 + aVar6.z * 0.5 + aVar8.z * 0.5;
      auVar45._12_4_ =
           aVar7.field_3.w * 0.5 + aVar9.field_3.w * 0.5 +
           aVar6.field_3.w * 0.5 + aVar8.field_3.w * 0.5;
      local_e8.m128 = (__m128)minps(local_e8.m128,auVar45);
      aVar55.m128 = (__m128)maxps(aVar55.m128,auVar45);
      fVar49 = (pPVar30->time_range).lower;
      if (fVar49 <= fVar62) {
        fVar62 = fVar49;
      }
      fVar50 = (pPVar30->time_range).upper;
      fVar61 = fVar50;
      if (fVar50 <= fVar29) {
        fVar61 = fVar29;
      }
      sVar36 = sVar36 + (uint)(pPVar30->lbounds).bounds1.lower.field_0.m128[3];
      uVar32 = (ulong)(uint)(pPVar30->lbounds).bounds1.upper.field_0.m128[3];
      bVar39 = uVar38 < uVar32;
      if (uVar38 <= uVar32) {
        uVar38 = uVar32;
      }
      uVar42 = (int)((uint)bVar39 << 0x1f) >> 0x1f;
      uVar46 = (int)((uint)bVar39 << 0x1f) >> 0x1f;
      fVar43 = (float)(~uVar42 & (uint)fVar43 | (uint)fVar49 & uVar42);
      fVar47 = (float)(~uVar46 & (uint)fVar47 | (uint)fVar50 & uVar46);
      pPVar30 = pPVar30 + 1;
      fVar29 = fVar61;
    }
    fVar61 = fVar60;
    if (pPVar1 < pPVar30) break;
    fVar49 = pPVar34[-1].lbounds.bounds0.lower.field_0.m128[3];
    pPVar34 = pPVar1;
    while (fVar49 != fVar40) {
      aVar6 = (pPVar34->lbounds).bounds0.lower.field_0.field_1;
      aVar7 = (pPVar34->lbounds).bounds0.upper.field_0.field_1;
      aVar8 = (pPVar34->lbounds).bounds1.lower.field_0.field_1;
      aVar9 = (pPVar34->lbounds).bounds1.upper.field_0.field_1;
      local_128.m128 = (__m128)minps(local_128.m128,(undefined1  [16])aVar8);
      aVar54.m128 = (__m128)minps(aVar54.m128,(undefined1  [16])aVar6);
      local_118.m128 = (__m128)maxps(local_118.m128,(undefined1  [16])aVar9);
      aVar53.m128 = (__m128)maxps(aVar53.m128,(undefined1  [16])aVar7);
      fVar49 = aVar7.x * 0.5 + aVar9.x * 0.5 + aVar6.x * 0.5 + aVar8.x * 0.5;
      fVar60 = aVar7.y * 0.5 + aVar9.y * 0.5 + aVar6.y * 0.5 + aVar8.y * 0.5;
      fVar50 = aVar7.z * 0.5 + aVar9.z * 0.5 + aVar6.z * 0.5 + aVar8.z * 0.5;
      fVar51 = aVar7.field_3.w * 0.5 + aVar9.field_3.w * 0.5 +
               aVar6.field_3.w * 0.5 + aVar8.field_3.w * 0.5;
      auVar14._4_4_ = fVar60;
      auVar14._0_4_ = fVar49;
      auVar14._8_4_ = fVar50;
      auVar14._12_4_ = fVar51;
      local_108.m128 = (__m128)minps(local_108.m128,auVar14);
      auVar15._4_4_ = fVar60;
      auVar15._0_4_ = fVar49;
      auVar15._8_4_ = fVar50;
      auVar15._12_4_ = fVar51;
      local_f8.m128 = (__m128)maxps(local_f8.m128,auVar15);
      fVar49 = (pPVar34->time_range).lower;
      if (fVar49 <= local_12c) {
        local_12c = fVar49;
      }
      fVar50 = (pPVar34->time_range).upper;
      fVar60 = fVar50;
      if (fVar50 <= fVar61) {
        fVar60 = fVar61;
      }
      sVar37 = (uint)(pPVar34->lbounds).bounds1.lower.field_0.m128[3] + sVar37;
      uVar32 = (ulong)(uint)(pPVar34->lbounds).bounds1.upper.field_0.m128[3];
      uVar42 = (int)((uint)(uVar33 < uVar32) << 0x1f) >> 0x1f;
      uVar46 = (int)((uint)(uVar33 < uVar32) << 0x1f) >> 0x1f;
      fVar41 = (float)(~uVar42 & (uint)fVar41 | (uint)fVar49 & uVar42);
      fVar44 = (float)(~uVar46 & (uint)fVar44 | (uint)fVar50 & uVar46);
      if (uVar32 < uVar33) {
        uVar32 = uVar33;
      }
      uVar33 = uVar32;
      fVar61 = fVar60;
      if (pPVar34 + -1 < pPVar30) goto LAB_0018b9ee;
      fVar49 = pPVar34[-1].lbounds.bounds0.lower.field_0.m128[3];
      pPVar34 = pPVar34 + -1;
    }
    if (pPVar34 < pPVar30) break;
    aVar6 = (pPVar34->lbounds).bounds0.lower.field_0.field_1;
    aVar7 = (pPVar34->lbounds).bounds0.upper.field_0.field_1;
    aVar8 = (pPVar34->lbounds).bounds1.lower.field_0.field_1;
    aVar9 = (pPVar34->lbounds).bounds1.upper.field_0.field_1;
    aVar57.m128 = (__m128)minps(aVar57.m128,(undefined1  [16])aVar8);
    aVar56.m128 = (__m128)minps(aVar56.m128,(undefined1  [16])aVar6);
    fVar51 = (pPVar34->time_range).lower;
    fVar58 = (pPVar34->time_range).upper;
    fVar60 = (pPVar34->lbounds).bounds1.lower.field_0.m128[3];
    uVar35 = (ulong)(uint)(pPVar34->lbounds).bounds1.upper.field_0.m128[3];
    uVar16 = *(undefined8 *)&(pPVar30->lbounds).bounds0.lower.field_0;
    uVar17 = *(undefined8 *)((long)&(pPVar30->lbounds).bounds0.lower.field_0 + 8);
    aVar26 = (pPVar30->lbounds).bounds0.lower.field_0;
    pVVar2 = &(pPVar30->lbounds).bounds0.upper;
    uVar18 = *(undefined8 *)&pVVar2->field_0;
    uVar19 = *(undefined8 *)((long)&(pPVar30->lbounds).bounds0.upper.field_0 + 8);
    aVar27 = pVVar2->field_0;
    pBVar3 = &(pPVar30->lbounds).bounds1;
    uVar20 = *(undefined8 *)&(pBVar3->lower).field_0;
    uVar21 = *(undefined8 *)((long)&(pPVar30->lbounds).bounds1.lower.field_0 + 8);
    aVar25 = (pBVar3->lower).field_0;
    pVVar2 = &(pPVar30->lbounds).bounds1.upper;
    uVar22 = *(undefined8 *)&pVVar2->field_0;
    uVar23 = *(undefined8 *)((long)&(pPVar30->lbounds).bounds1.upper.field_0 + 8);
    aVar28 = pVVar2->field_0;
    BVar4 = pPVar30->time_range;
    fVar50 = (pPVar30->lbounds).bounds1.lower.field_0.m128[3];
    uVar32 = (ulong)(uint)(pPVar30->lbounds).bounds1.upper.field_0.m128[3];
    (pPVar30->lbounds).bounds0.lower.field_0.field_1 = aVar6;
    local_d8.m128 = (__m128)maxps(local_d8.m128,(undefined1  [16])aVar9);
    aVar59.m128 = (__m128)maxps(aVar59.m128,(undefined1  [16])aVar7);
    auVar48._0_4_ = aVar7.x * 0.5 + aVar9.x * 0.5 + aVar6.x * 0.5 + aVar8.x * 0.5;
    auVar48._4_4_ = aVar7.y * 0.5 + aVar9.y * 0.5 + aVar6.y * 0.5 + aVar8.y * 0.5;
    auVar48._8_4_ = aVar7.z * 0.5 + aVar9.z * 0.5 + aVar6.z * 0.5 + aVar8.z * 0.5;
    auVar48._12_4_ =
         aVar7.field_3.w * 0.5 + aVar9.field_3.w * 0.5 +
         aVar6.field_3.w * 0.5 + aVar8.field_3.w * 0.5;
    local_e8.m128 = (__m128)minps(local_e8.m128,auVar48);
    aVar55.m128 = (__m128)maxps(aVar55.m128,auVar48);
    fVar49 = fVar58;
    if (fVar58 <= fVar29) {
      fVar49 = fVar29;
    }
    sVar36 = sVar36 + (uint)fVar60;
    if (fVar51 <= fVar62) {
      fVar62 = fVar51;
    }
    uVar42 = (int)((uint)(uVar38 < uVar35) << 0x1f) >> 0x1f;
    uVar46 = (int)((uint)(uVar38 < uVar35) << 0x1f) >> 0x1f;
    fVar43 = (float)(~uVar42 & (uint)fVar43 | (uint)fVar51 & uVar42);
    fVar47 = (float)(~uVar46 & (uint)fVar47 | (uint)fVar58 & uVar46);
    uVar24 = *(undefined8 *)((long)&(pPVar34->lbounds).bounds0.upper.field_0 + 8);
    *(undefined8 *)&(pPVar30->lbounds).bounds0.upper.field_0 =
         *(undefined8 *)&(pPVar34->lbounds).bounds0.upper.field_0;
    *(undefined8 *)((long)&(pPVar30->lbounds).bounds0.upper.field_0 + 8) = uVar24;
    uVar24 = *(undefined8 *)((long)&(pPVar34->lbounds).bounds1.lower.field_0 + 8);
    *(undefined8 *)&(pPVar30->lbounds).bounds1.lower.field_0 =
         *(undefined8 *)&(pPVar34->lbounds).bounds1.lower.field_0;
    *(undefined8 *)((long)&(pPVar30->lbounds).bounds1.lower.field_0 + 8) = uVar24;
    uVar24 = *(undefined8 *)((long)&(pPVar34->lbounds).bounds1.upper.field_0 + 8);
    *(undefined8 *)&(pPVar30->lbounds).bounds1.upper.field_0 =
         *(undefined8 *)&(pPVar34->lbounds).bounds1.upper.field_0;
    *(undefined8 *)((long)&(pPVar30->lbounds).bounds1.upper.field_0 + 8) = uVar24;
    BVar5 = pPVar30->time_range;
    (pPVar30->time_range).lower = (pPVar34->time_range).lower;
    (pPVar30->time_range).upper = (pPVar34->time_range).upper;
    if (uVar38 <= uVar35) {
      uVar38 = uVar35;
    }
    local_128.m128 = (__m128)minps(local_128.m128,aVar25.m128);
    (pPVar34->lbounds).bounds0.lower.field_0 = aVar26;
    (pPVar34->lbounds).bounds0.upper.field_0 = aVar27;
    (pPVar34->lbounds).bounds1.lower.field_0 = aVar25;
    aVar54.m128 = (__m128)minps(aVar54.m128,aVar26.m128);
    local_118.m128 = (__m128)maxps(local_118.m128,aVar28.m128);
    (pPVar34->lbounds).bounds1.upper.field_0 = aVar28;
    aVar53.m128 = (__m128)maxps(aVar53.m128,aVar27.m128);
    auVar52._0_4_ =
         (float)uVar18 * 0.5 + (float)uVar22 * 0.5 + (float)uVar16 * 0.5 + (float)uVar20 * 0.5;
    auVar52._4_4_ =
         (float)((ulong)uVar18 >> 0x20) * 0.5 + (float)((ulong)uVar22 >> 0x20) * 0.5 +
         (float)((ulong)uVar16 >> 0x20) * 0.5 + (float)((ulong)uVar20 >> 0x20) * 0.5;
    auVar52._8_4_ =
         (float)uVar19 * 0.5 + (float)uVar23 * 0.5 + (float)uVar17 * 0.5 + (float)uVar21 * 0.5;
    auVar52._12_4_ =
         (float)((ulong)uVar19 >> 0x20) * 0.5 + (float)((ulong)uVar23 >> 0x20) * 0.5 +
         (float)((ulong)uVar17 >> 0x20) * 0.5 + (float)((ulong)uVar21 >> 0x20) * 0.5;
    local_108.m128 = (__m128)minps(local_108.m128,auVar52);
    local_f8.m128 = (__m128)maxps(local_f8.m128,auVar52);
    local_88 = BVar4.lower;
    fStack_84 = BVar4.upper;
    if (local_88 <= local_12c) {
      local_12c = local_88;
    }
    fVar60 = fStack_84;
    if (fStack_84 <= fVar61) {
      fVar60 = fVar61;
    }
    sVar37 = sVar37 + (uint)fVar50;
    uVar42 = (int)((uint)(uVar33 < uVar32) << 0x1f) >> 0x1f;
    uVar46 = (int)((uint)(uVar33 < uVar32) << 0x1f) >> 0x1f;
    fVar41 = (float)(~uVar42 & (uint)fVar41 | (uint)local_88 & uVar42);
    fVar44 = (float)(~uVar46 & (uint)fVar44 | (uint)fStack_84 & uVar46);
    pPVar34->time_range = BVar5;
    if (uVar33 <= uVar32) {
      uVar33 = uVar32;
    }
    pPVar30 = pPVar30 + 1;
  }
LAB_0018b9ee:
  uVar31 = ((long)pPVar30 - (long)pPVar12) / 0x50;
  pmVar13 = set->prims;
  BVar4 = (set->super_PrimInfoMB).time_range;
  (lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
  field_0 = aVar56;
  (lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
  field_0 = aVar59;
  (lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
  field_0 = aVar57;
  *(undefined8 *)
   &(lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper
    .field_0 = local_d8._0_8_;
  *(undefined8 *)
   ((long)&(lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds1.upper.field_0 + 8) = local_d8._8_8_;
  *(undefined8 *)
   &(lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0
       = local_e8._0_8_;
  *(undefined8 *)
   ((long)&(lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
           field_0 + 8) = local_e8._8_8_;
  (lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0 =
       aVar55;
  (lset->super_PrimInfoMB).num_time_segments = sVar36;
  (lset->super_PrimInfoMB).max_num_time_segments = uVar38;
  (lset->super_PrimInfoMB).max_time_range.lower = fVar43;
  (lset->super_PrimInfoMB).max_time_range.upper = fVar47;
  (lset->super_PrimInfoMB).time_range.lower = fVar62;
  (lset->super_PrimInfoMB).time_range.upper = fVar29;
  lset->prims = pmVar13;
  (lset->super_PrimInfoMB).object_range._begin = uVar10;
  (lset->super_PrimInfoMB).object_range._end = uVar31;
  BVar5 = (lset->super_PrimInfoMB).time_range;
  fVar43 = BVar5.lower;
  fVar47 = BVar5.upper;
  fVar40 = BVar4.lower;
  fVar62 = BVar4.upper;
  uVar42 = -(uint)(fVar43 < fVar40);
  uVar46 = -(uint)(fVar47 < fVar62);
  (lset->super_PrimInfoMB).time_range =
       (BBox1f)(CONCAT44(~uVar46 & (uint)fVar62,~uVar42 & (uint)fVar43) |
               CONCAT44((uint)fVar47 & uVar46,(uint)fVar40 & uVar42));
  pmVar13 = set->prims;
  BVar4 = (set->super_PrimInfoMB).time_range;
  (rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
  field_0 = aVar54;
  (rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
  field_0 = aVar53;
  *(undefined8 *)
   &(rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower
    .field_0 = local_128._0_8_;
  *(undefined8 *)
   ((long)&(rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds1.lower.field_0 + 8) = local_128._8_8_;
  *(undefined8 *)
   &(rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper
    .field_0 = local_118._0_8_;
  *(undefined8 *)
   ((long)&(rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds1.upper.field_0 + 8) = local_118._8_8_;
  *(undefined8 *)
   &(rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0
       = local_108._0_8_;
  *(undefined8 *)
   ((long)&(rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
           field_0 + 8) = local_108._8_8_;
  *(undefined8 *)
   &(rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0
       = local_f8._0_8_;
  *(undefined8 *)
   ((long)&(rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
           field_0 + 8) = local_f8._8_8_;
  (rset->super_PrimInfoMB).num_time_segments = sVar37;
  (rset->super_PrimInfoMB).max_num_time_segments = uVar33;
  (rset->super_PrimInfoMB).max_time_range.lower = fVar41;
  (rset->super_PrimInfoMB).max_time_range.upper = fVar44;
  (rset->super_PrimInfoMB).time_range.lower = local_12c;
  (rset->super_PrimInfoMB).time_range.upper = fVar61;
  rset->prims = pmVar13;
  (rset->super_PrimInfoMB).object_range._begin = uVar31;
  (rset->super_PrimInfoMB).object_range._end = uVar11;
  BVar5 = (rset->super_PrimInfoMB).time_range;
  fVar44 = BVar5.lower;
  fVar62 = BVar5.upper;
  fVar40 = BVar4.lower;
  fVar41 = BVar4.upper;
  uVar42 = -(uint)(fVar44 < fVar40);
  uVar46 = -(uint)(fVar62 < fVar41);
  (rset->super_PrimInfoMB).time_range =
       (BBox1f)(CONCAT44(~uVar46 & (uint)fVar41,~uVar42 & (uint)fVar44) |
               CONCAT44((uint)fVar62 & uVar46,(uint)fVar40 & uVar42));
  return;
}

Assistant:

void splitByGeometry(const SetMB& set, SetMB& lset, SetMB& rset)
          {
            assert(set.size() > 1);

            mvector<PrimRefMB>& prims = *set.prims;
            const size_t begin = set.begin();
            const size_t end   = set.end();
            
            PrimInfoMB left(empty);
            PrimInfoMB right(empty);
            unsigned int geomID = prims[begin].geomID();
            size_t center = serial_partitioning(prims.data(),begin,end,left,right,
                                                [&] ( const PrimRefMB& prim ) { return prim.geomID() == geomID; },
                                                [ ] ( PrimInfoMB& dst, const PrimRefMB& prim ) { dst.add_primref(prim); });
            
            new (&lset) SetMB(left, set.prims,range<size_t>(begin,center),set.time_range);
            new (&rset) SetMB(right,set.prims,range<size_t>(center,end  ),set.time_range);
          }